

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall CRegexParser::alternate_onto(CRegexParser *this,re_machine *dest,re_machine *rhs)

{
  re_machine in_RAX;
  re_machine new_machine;
  re_machine local_18;
  
  if (dest->init == -1) {
    local_18 = *rhs;
  }
  else {
    if (rhs->init == -1) {
      return;
    }
    local_18 = in_RAX;
    build_alter(this,&local_18,dest,rhs);
  }
  *dest = local_18;
  return;
}

Assistant:

void CRegexParser::alternate_onto(re_machine *dest, re_machine *rhs)
{
    /* check to see if the first machine is null */
    if (is_machine_null(dest))
    {
        /* 
         *   the first machine is null - simply copy the second machine
         *   onto the first 
         */
        *dest = *rhs;
    }
    else
    {
        /* 
         *   if the second machine is null, don't do anything; otherwise,
         *   build the alternation 
         */
        if (!is_machine_null(rhs))
        {
            re_machine new_machine;
            
            /* build the alternation */
            build_alter(&new_machine, dest, rhs);

            /* replace the first machine with the alternation */
            *dest = new_machine;
        }
    }
}